

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O2

void getDFDComponentInfoUnpacked
               (uint32_t *DFD,uint32_t *numComponents,uint32_t *componentByteLength)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar1 = DFD[2];
  *numComponents = 0;
  uVar3 = 0xffffffff;
  for (lVar2 = 0; (ulong)((uVar1 >> 0x12) - 6 >> 2) << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    uVar5 = *(uint *)((long)DFD + lVar2 + 0x1c);
    uVar4 = (uVar5 >> 0x10 & 0xff) + 1 >> 3;
    uVar5 = uVar5 >> 0x18 & 0xf;
    if (uVar5 == uVar3) {
      uVar4 = uVar4 + *componentByteLength;
    }
    else {
      *numComponents = *numComponents + 1;
      uVar3 = uVar5;
    }
    *componentByteLength = uVar4;
  }
  return;
}

Assistant:

void
getDFDComponentInfoUnpacked(const uint32_t* DFD, uint32_t* numComponents,
                            uint32_t* componentByteLength)
{
    const uint32_t *BDFDB = DFD+1;
    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    uint32_t sampleNumber;
    uint32_t currentChannel = ~0U; /* Don't start matched. */

    /* This is specifically for unpacked formats which means the size of */
    /* each component is the same. */
    *numComponents = 0;
    for (sampleNumber = 0; sampleNumber < numSamples; ++sampleNumber) {
        uint32_t sampleByteLength = (KHR_DFDSVAL(BDFDB, sampleNumber, BITLENGTH) + 1) >> 3U;
        uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleNumber, CHANNELID);

        if (sampleChannel == currentChannel) {
            /* Continuation of the same channel. */
            /* Accumulate the byte length. */
            *componentByteLength += sampleByteLength;
        } else {
            /* Everything is new. Hopefully. */
            currentChannel = sampleChannel;
            (*numComponents)++;
            *componentByteLength = sampleByteLength;
        }
    }
}